

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O2

void liblogger::LogManager::Add(shared_ptr<liblogger::ILogger> *Log)

{
  LogManagerScopedLock lock;
  LogManagerScopedLock local_9;
  
  Lock();
  local_9.m_locked = true;
  std::__cxx11::
  list<std::shared_ptr<liblogger::ILogger>,_std::allocator<std::shared_ptr<liblogger::ILogger>_>_>::
  push_back((list<std::shared_ptr<liblogger::ILogger>,_std::allocator<std::shared_ptr<liblogger::ILogger>_>_>
             *)&m_loggers_abi_cxx11_,Log);
  local_9.m_locked = false;
  Unlock();
  LogManagerScopedLock::~LogManagerScopedLock(&local_9);
  return;
}

Assistant:

void LogManager::Add(std::shared_ptr<ILogger> Log)
{
	LogManagerScopedLock lock = LogManagerScopedLock();
	m_loggers.push_back(Log);
	lock.Unlock();
#ifdef DEBUG
	std::string str = Log->GetName();
	Logger(LOGGER_DEBUG, "Added Logger: %s", str.c_str());
#endif
}